

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenTableUnionAsGetters(CppGenerator *this,FieldDef *field)

{
  CodeWriter *this_00;
  EnumVal *ev;
  Namespace *ns;
  CppGenerator *pCVar1;
  string full_struct_name;
  allocator<char> local_199;
  CppGenerator *local_198;
  EnumDef *local_190;
  FieldDef *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  IDLOptions *local_140;
  pointer local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_190 = (field->value).type.enum_def;
  local_188 = field;
  if (local_190->uses_multiple_type_instances == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               "  template<typename T> const T *{{NULLABLE_EXT}}{{FIELD_NAME}}_as() const;",
               (allocator<char> *)&local_f0);
    CodeWriter::operator+=(&this->code_,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  local_140 = &(this->opts_).super_IDLOptions;
  this_00 = &this->code_;
  local_198 = this;
  for (local_138 = (local_190->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar1 = local_198,
      local_138 !=
      (local_190->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; local_138 = local_138 + 1) {
    ev = *local_138;
    if ((ev->union_type).base_type != BASE_TYPE_NONE) {
      GetUnionElement_abi_cxx11_(&local_f0,local_198,ev,false,local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"U_GET_TYPE",(allocator<char> *)&local_b0);
      Name_abi_cxx11_(&local_130,pCVar1,local_188);
      std::operator+(&local_180,&local_130,"_type");
      EscapeKeyword(&local_110,local_198,&local_180);
      CodeWriter::SetValue(this_00,&local_160,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"U_ELEMENT_TYPE",(allocator<char> *)&local_130);
      pCVar1 = local_198;
      ns = (local_190->super_Definition).defined_namespace;
      GetEnumValUse_abi_cxx11_(&local_180,local_198,local_190,ev);
      BaseGenerator::WrapInNameSpace(&local_110,&pCVar1->super_BaseGenerator,ns,&local_180);
      CodeWriter::SetValue(this_00,&local_160,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"U_FIELD_TYPE",(allocator<char> *)&local_130);
      std::operator+(&local_180,"const ",&local_f0);
      std::operator+(&local_110,&local_180," *");
      CodeWriter::SetValue(this_00,&local_160,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"U_FIELD_NAME",&local_199);
      Name_abi_cxx11_(&local_130,local_198,local_188);
      std::operator+(&local_180,&local_130,"_as_");
      EscapeKeyword(&local_b0,local_198,&ev->name);
      std::operator+(&local_110,&local_180,&local_b0);
      CodeWriter::SetValue(this_00,&local_160,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"U_NULLABLE",(allocator<char> *)&local_180);
      NullableExtension_abi_cxx11_(&local_110,local_198);
      CodeWriter::SetValue(this_00,&local_160,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"  {{U_FIELD_TYPE}}{{U_NULLABLE}}{{U_FIELD_NAME}}() const {",
                 (allocator<char> *)&local_160);
      CodeWriter::operator+=(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "    return {{U_GET_TYPE}}() == {{U_ELEMENT_TYPE}} ? static_cast<{{U_FIELD_TYPE}}>({{FIELD_NAME}}()) : nullptr;"
                 ,(allocator<char> *)&local_160);
      CodeWriter::operator+=(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"  }",(allocator<char> *)&local_160);
      CodeWriter::operator+=(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f0);
    }
  }
  return;
}

Assistant:

void GenTableUnionAsGetters(const FieldDef &field) {
    const auto &type = field.value.type;
    auto u = type.enum_def;

    if (!type.enum_def->uses_multiple_type_instances)
      code_ +=
          "  template<typename T> "
          "const T *{{NULLABLE_EXT}}{{FIELD_NAME}}_as() const;";

    for (auto u_it = u->Vals().begin(); u_it != u->Vals().end(); ++u_it) {
      auto &ev = **u_it;
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      auto full_struct_name = GetUnionElement(ev, false, opts_);

      // @TODO: Mby make this decisions more universal? How?
      code_.SetValue("U_GET_TYPE",
                     EscapeKeyword(Name(field) + UnionTypeFieldSuffix()));
      code_.SetValue("U_ELEMENT_TYPE", WrapInNameSpace(u->defined_namespace,
                                                       GetEnumValUse(*u, ev)));
      code_.SetValue("U_FIELD_TYPE", "const " + full_struct_name + " *");
      code_.SetValue("U_FIELD_NAME", Name(field) + "_as_" + Name(ev));
      code_.SetValue("U_NULLABLE", NullableExtension());

      // `const Type *union_name_asType() const` accessor.
      code_ += "  {{U_FIELD_TYPE}}{{U_NULLABLE}}{{U_FIELD_NAME}}() const {";
      code_ +=
          "    return {{U_GET_TYPE}}() == {{U_ELEMENT_TYPE}} ? "
          "static_cast<{{U_FIELD_TYPE}}>({{FIELD_NAME}}()) "
          ": nullptr;";
      code_ += "  }";
    }
  }